

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml_sse3.c
# Opt level: O3

void av1_nn_predict_sse3(float *input_nodes,NN_CONFIG *nn_config,int reduce_prec,float *output)

{
  float *pfVar1;
  float *pfVar2;
  uint uVar3;
  uint uVar4;
  float *pfVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  int *piVar15;
  ulong uVar16;
  uint uVar17;
  float *pfVar18;
  float *pfVar19;
  long lVar20;
  bool bVar21;
  ulong uVar22;
  ulong uVar23;
  float *pfVar24;
  int in_node;
  long lVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  float *pfVar31;
  float *pfVar32;
  __m128 zero;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  undefined1 auVar40 [16];
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float buf [2] [128];
  float local_4a8 [16];
  int *local_468;
  int *local_460;
  NN_CONFIG *local_458;
  ulong local_450;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_438 [254];
  __m128 add [4];
  
  uVar16 = (ulong)(uint)nn_config->num_hidden_layers;
  if (-1 < nn_config->num_hidden_layers) {
    local_460 = &nn_config->num_outputs;
    local_468 = nn_config->num_hidden_nodes;
    uVar17 = 0;
    uVar30 = 0;
    uVar3 = nn_config->num_inputs;
    local_458 = nn_config;
    do {
      uVar23 = (ulong)uVar3;
      uVar16 = uVar16 & 0xffffffff;
      pfVar24 = local_438 + (ulong)uVar17 * 0x80;
      if (uVar30 == uVar16) {
        pfVar24 = output;
      }
      pfVar32 = local_458->weights[uVar30];
      piVar15 = local_468 + uVar30;
      if (uVar30 == uVar16) {
        piVar15 = local_460;
      }
      uVar4 = *piVar15;
      pfVar5 = local_458->bias[uVar30];
      uVar28 = (ulong)uVar4;
      if ((uVar4 & 7) == 0 && (uVar3 & 3) == 0) {
        if (0 < (int)uVar4) {
          lVar25 = (long)(int)uVar3;
          pfVar19 = pfVar32 + lVar25;
          uVar22 = 0;
          do {
            auVar33 = *(undefined1 (*) [16])(pfVar5 + uVar22);
            auVar40 = *(undefined1 (*) [16])(pfVar5 + uVar22 + 4);
            if (0 < (int)uVar3) {
              lVar29 = 0;
              pfVar18 = pfVar19;
              pfVar31 = pfVar32;
              auVar37 = auVar33;
              auVar38 = auVar40;
              do {
                pfVar1 = input_nodes + lVar29;
                fVar39 = *pfVar1;
                fVar41 = pfVar1[1];
                fVar42 = pfVar1[2];
                fVar43 = pfVar1[3];
                lVar20 = 0;
                lVar27 = 0;
                do {
                  pfVar2 = (float *)((long)pfVar31 + lVar20);
                  fVar44 = pfVar2[2];
                  fVar45 = pfVar2[3];
                  pfVar1 = (float *)((long)pfVar18 + lVar20);
                  fVar7 = *pfVar1;
                  fVar8 = pfVar1[1];
                  fVar9 = pfVar1[2];
                  fVar10 = pfVar1[3];
                  *(float *)((long)local_4a8 + lVar27) = *pfVar2 * fVar39 + pfVar2[1] * fVar41;
                  *(float *)((long)local_4a8 + lVar27 + 4) = fVar44 * fVar42 + fVar45 * fVar43;
                  *(float *)((long)local_4a8 + lVar27 + 8) = fVar7 * fVar39 + fVar8 * fVar41;
                  *(float *)((long)local_4a8 + lVar27 + 0xc) = fVar9 * fVar42 + fVar10 * fVar43;
                  lVar27 = lVar27 + 0x10;
                  lVar20 = lVar20 + lVar25 * 8;
                } while (lVar27 != 0x40);
                auVar33._0_4_ = auVar37._0_4_ + local_4a8[0] + local_4a8[1];
                auVar33._4_4_ = auVar37._4_4_ + local_4a8[2] + local_4a8[3];
                auVar33._8_4_ = auVar37._8_4_ + local_4a8[4] + local_4a8[5];
                auVar33._12_4_ = auVar37._12_4_ + local_4a8[6] + local_4a8[7];
                auVar40._0_4_ = auVar38._0_4_ + local_4a8[8] + local_4a8[9];
                auVar40._4_4_ = auVar38._4_4_ + local_4a8[10] + local_4a8[0xb];
                auVar40._8_4_ = auVar38._8_4_ + local_4a8[0xc] + local_4a8[0xd];
                auVar40._12_4_ = auVar38._12_4_ + local_4a8[0xe] + local_4a8[0xf];
                lVar29 = lVar29 + 4;
                pfVar18 = pfVar18 + 4;
                pfVar31 = pfVar31 + 4;
                auVar37 = auVar33;
                auVar38 = auVar40;
              } while (lVar29 < lVar25);
            }
            if (uVar30 != uVar16) {
              auVar40 = maxps(auVar40,ZEXT816(0));
              auVar33 = maxps(auVar33,ZEXT816(0));
            }
            *(undefined1 (*) [16])(pfVar24 + (uVar22 | 4)) = auVar40;
            *(undefined1 (*) [16])(pfVar24 + uVar22) = auVar33;
            uVar22 = uVar22 + 8;
            pfVar19 = pfVar19 + uVar23 * 8;
            pfVar32 = pfVar32 + uVar23 * 8;
          } while (uVar22 < uVar28);
        }
      }
      else if ((uVar4 & 3) == 0 && (uVar3 & 7) == 0) {
        if (0 < (int)uVar4) {
          pfVar32 = pfVar32 + 4;
          uVar22 = 0;
          do {
            auVar34 = *(undefined1 (*) [16])(pfVar5 + uVar22);
            if (0 < (int)uVar3) {
              lVar25 = 0;
              pfVar19 = pfVar32;
              auVar37 = auVar34;
              do {
                pfVar18 = input_nodes + lVar25;
                fVar39 = *pfVar18;
                fVar41 = pfVar18[1];
                fVar42 = pfVar18[2];
                fVar43 = pfVar18[3];
                pfVar18 = input_nodes + lVar25 + 4;
                fVar44 = *pfVar18;
                fVar45 = pfVar18[1];
                fVar7 = pfVar18[2];
                fVar8 = pfVar18[3];
                lVar29 = 0;
                pfVar18 = pfVar19;
                do {
                  fVar9 = pfVar18[-3];
                  fVar10 = pfVar18[-2];
                  fVar11 = pfVar18[-1];
                  fVar12 = pfVar18[1];
                  fVar13 = pfVar18[2];
                  fVar14 = pfVar18[3];
                  *(float *)((long)local_4a8 + lVar29) = *pfVar18 * fVar44 + pfVar18[-4] * fVar39;
                  *(float *)((long)local_4a8 + lVar29 + 4) = fVar12 * fVar45 + fVar9 * fVar41;
                  *(float *)((long)local_4a8 + lVar29 + 8) = fVar13 * fVar7 + fVar10 * fVar42;
                  *(float *)((long)local_4a8 + lVar29 + 0xc) = fVar14 * fVar8 + fVar11 * fVar43;
                  lVar29 = lVar29 + 0x10;
                  pfVar18 = pfVar18 + (int)uVar3;
                } while (lVar29 != 0x40);
                auVar34._0_4_ =
                     auVar37._0_4_ + local_4a8[0] + local_4a8[1] + local_4a8[2] + local_4a8[3];
                auVar34._4_4_ =
                     auVar37._4_4_ + local_4a8[4] + local_4a8[5] + local_4a8[6] + local_4a8[7];
                auVar34._8_4_ =
                     auVar37._8_4_ + local_4a8[8] + local_4a8[9] + local_4a8[10] + local_4a8[0xb];
                auVar34._12_4_ =
                     auVar37._12_4_ +
                     local_4a8[0xc] + local_4a8[0xd] + local_4a8[0xe] + local_4a8[0xf];
                lVar25 = lVar25 + 8;
                pfVar19 = pfVar19 + 8;
                auVar37 = auVar34;
              } while (lVar25 < (int)uVar3);
            }
            if (uVar30 != uVar16) {
              auVar34 = maxps(auVar34,ZEXT816(0));
            }
            *(undefined1 (*) [16])(pfVar24 + uVar22) = auVar34;
            uVar22 = uVar22 + 4;
            pfVar32 = pfVar32 + uVar23 * 4;
          } while (uVar22 < uVar28);
        }
      }
      else if (((uVar3 | uVar4) & 3) == 0) {
        if (0 < (int)uVar4) {
          lVar25 = (long)(int)uVar3;
          uVar22 = 0;
          local_450 = uVar23;
          do {
            auVar35 = *(undefined1 (*) [16])(pfVar5 + uVar22);
            if (0 < (int)uVar3) {
              lVar29 = uVar22 * local_450;
              lVar20 = 0;
              auVar37 = auVar35;
              do {
                pfVar19 = input_nodes + lVar20;
                fVar39 = *pfVar19;
                fVar41 = pfVar19[1];
                fVar42 = pfVar19[2];
                fVar43 = pfVar19[3];
                uVar23 = 0;
                pfVar19 = local_4a8;
                bVar6 = true;
                do {
                  bVar21 = bVar6;
                  pfVar18 = pfVar32 + lVar29 + lVar20 + uVar23 * lVar25;
                  fVar44 = pfVar18[2];
                  fVar45 = pfVar18[3];
                  pfVar31 = pfVar32 + lVar29 + lVar20 + (uVar23 | 1) * lVar25;
                  fVar7 = *pfVar31;
                  fVar8 = pfVar31[1];
                  fVar9 = pfVar31[2];
                  fVar10 = pfVar31[3];
                  *pfVar19 = *pfVar18 * fVar39 + pfVar18[1] * fVar41;
                  pfVar19[1] = fVar44 * fVar42 + fVar45 * fVar43;
                  pfVar19[2] = fVar7 * fVar39 + fVar8 * fVar41;
                  pfVar19[3] = fVar9 * fVar42 + fVar10 * fVar43;
                  uVar23 = 2;
                  pfVar19 = &local_448;
                  bVar6 = false;
                } while (bVar21);
                auVar35._0_4_ = auVar37._0_4_ + local_4a8[0] + local_4a8[1];
                auVar35._4_4_ = auVar37._4_4_ + local_4a8[2] + local_4a8[3];
                auVar35._8_4_ = auVar37._8_4_ + local_448 + fStack_444;
                auVar35._12_4_ = auVar37._12_4_ + fStack_440 + fStack_43c;
                lVar20 = lVar20 + 4;
                auVar37 = auVar35;
              } while (lVar20 < lVar25);
            }
            if (uVar30 != uVar16) {
              auVar35 = maxps(auVar35,ZEXT816(0));
            }
            *(undefined1 (*) [16])(pfVar24 + uVar22) = auVar35;
            uVar22 = uVar22 + 4;
          } while (uVar22 < uVar28);
        }
      }
      else if ((uVar3 & 7) == 0) {
        if (0 < (int)uVar4) {
          pfVar32 = pfVar32 + 4;
          uVar22 = 0;
          do {
            fVar39 = pfVar5[uVar22];
            auVar37._4_4_ = fVar39;
            auVar37._0_4_ = fVar39;
            auVar37._8_4_ = fVar39;
            auVar37._12_4_ = fVar39;
            if (0 < (int)uVar3) {
              lVar25 = 0;
              auVar38 = auVar37;
              do {
                pfVar19 = input_nodes + lVar25;
                pfVar31 = input_nodes + lVar25 + 4;
                pfVar1 = pfVar32 + lVar25 + -4;
                pfVar18 = pfVar32 + lVar25;
                fVar39 = *pfVar18 * *pfVar31 + *pfVar1 * *pfVar19;
                fVar42 = pfVar18[1] * pfVar31[1] + pfVar1[1] * pfVar19[1];
                fVar44 = pfVar18[2] * pfVar31[2] + pfVar1[2] * pfVar19[2];
                fVar45 = pfVar18[3] * pfVar31[3] + pfVar1[3] * pfVar19[3];
                fVar41 = fVar39 + fVar42;
                fVar43 = fVar44 + fVar45;
                fVar39 = fVar39 + fVar42;
                fVar44 = fVar44 + fVar45;
                auVar37._0_4_ = auVar38._0_4_ + fVar41 + fVar43;
                auVar37._4_4_ = auVar38._4_4_ + fVar39 + fVar44;
                auVar37._8_4_ = auVar38._8_4_ + fVar41 + fVar43;
                auVar37._12_4_ = auVar38._12_4_ + fVar39 + fVar44;
                lVar25 = lVar25 + 8;
                auVar38 = auVar37;
              } while (lVar25 < (int)uVar3);
            }
            if (uVar30 != uVar16) {
              auVar37 = maxps(auVar37,ZEXT816(0));
            }
            pfVar24[uVar22] = auVar37._0_4_;
            uVar22 = uVar22 + 1;
            pfVar32 = pfVar32 + uVar23;
          } while (uVar22 != uVar28);
        }
      }
      else if ((uVar3 & 3) == 0) {
        if (0 < (int)uVar4) {
          uVar22 = 0;
          do {
            fVar39 = pfVar5[uVar22];
            auVar38._4_4_ = fVar39;
            auVar38._0_4_ = fVar39;
            auVar38._8_4_ = fVar39;
            auVar38._12_4_ = fVar39;
            if (0 < (int)uVar3) {
              lVar25 = 0;
              auVar37 = auVar38;
              do {
                auVar38 = *(undefined1 (*) [16])(input_nodes + lVar25);
                pfVar19 = pfVar32 + lVar25;
                fVar39 = *pfVar19 * auVar38._0_4_;
                fVar42 = pfVar19[1] * auVar38._4_4_;
                fVar44 = pfVar19[2] * auVar38._8_4_;
                fVar45 = pfVar19[3] * auVar38._12_4_;
                fVar41 = fVar39 + fVar42;
                fVar43 = fVar44 + fVar45;
                fVar39 = fVar39 + fVar42;
                fVar44 = fVar44 + fVar45;
                auVar38._0_4_ = auVar37._0_4_ + fVar41 + fVar43;
                auVar38._4_4_ = auVar37._4_4_ + fVar39 + fVar44;
                auVar38._8_4_ = auVar37._8_4_ + fVar41 + fVar43;
                auVar38._12_4_ = auVar37._12_4_ + fVar39 + fVar44;
                lVar25 = lVar25 + 4;
                auVar37 = auVar38;
              } while (lVar25 < (int)uVar3);
            }
            if (uVar30 != uVar16) {
              auVar38 = maxps(auVar38,ZEXT816(0));
            }
            pfVar24[uVar22] = auVar38._0_4_;
            uVar22 = uVar22 + 1;
            pfVar32 = pfVar32 + uVar23;
          } while (uVar22 != uVar28);
        }
      }
      else if (0 < (int)uVar4) {
        uVar22 = 0;
        do {
          fVar39 = pfVar5[uVar22];
          auVar36._4_4_ = fVar39;
          auVar36._0_4_ = fVar39;
          auVar36._8_4_ = fVar39;
          auVar36._12_4_ = fVar39;
          if (0 < (int)uVar3) {
            uVar26 = 0;
            auVar37 = auVar36;
            do {
              fVar39 = input_nodes[uVar26] * pfVar32[uVar26];
              auVar36._0_4_ = auVar37._0_4_ + fVar39;
              auVar36._4_4_ = auVar37._4_4_ + fVar39;
              auVar36._8_4_ = auVar37._8_4_ + fVar39;
              auVar36._12_4_ = auVar37._12_4_ + fVar39;
              uVar26 = uVar26 + 1;
              auVar37 = auVar36;
            } while (uVar23 != uVar26);
          }
          if (uVar30 != uVar16) {
            auVar36 = maxps(auVar36,ZEXT816(0));
          }
          pfVar24[uVar22] = auVar36._0_4_;
          uVar22 = uVar22 + 1;
          pfVar32 = pfVar32 + uVar23;
        } while (uVar22 != uVar28);
      }
      uVar17 = 1 - uVar17;
      uVar16 = (ulong)local_458->num_hidden_layers;
      bVar6 = (long)uVar30 < (long)uVar16;
      nn_config = local_458;
      input_nodes = pfVar24;
      uVar30 = uVar30 + 1;
      uVar3 = uVar4;
    } while (bVar6);
  }
  if (reduce_prec == 0) {
    return;
  }
  av1_nn_output_prec_reduce(output,nn_config->num_outputs);
  return;
}

Assistant:

void av1_nn_predict_sse3(const float *input_nodes,
                         const NN_CONFIG *const nn_config, int reduce_prec,
                         float *const output) {
  float buf[2][NN_MAX_NODES_PER_LAYER];
  int buf_index = 0;
  int num_inputs = nn_config->num_inputs;

  // Hidden layers, except the final iteration is the output layer.
  for (int layer = 0; layer <= nn_config->num_hidden_layers; layer++) {
    const float *layer_weights = nn_config->weights[layer];
    const float *layer_bias = nn_config->bias[layer];
    bool output_layer = (layer == nn_config->num_hidden_layers);
    float *const output_nodes = output_layer ? output : &buf[buf_index][0];
    const int num_outputs = output_layer ? nn_config->num_outputs
                                         : nn_config->num_hidden_nodes[layer];

    if (num_inputs % 4 == 0 && num_outputs % 8 == 0) {
      for (int out = 0; out < num_outputs; out += 8) {
        __m128 out_h = _mm_loadu_ps(&layer_bias[out + 4]);
        __m128 out_l = _mm_loadu_ps(&layer_bias[out]);
        for (int in = 0; in < num_inputs; in += 4) {
          av1_nn_propagate_4to8_sse3(&input_nodes[in],
                                     &layer_weights[out * num_inputs + in],
                                     &out_h, &out_l, num_inputs);
        }
        if (!output_layer) nn_activate8(&out_h, &out_l);
        _mm_storeu_ps(&output_nodes[out + 4], out_h);
        _mm_storeu_ps(&output_nodes[out], out_l);
      }
    } else if (num_inputs % 8 == 0 && num_outputs % 4 == 0) {
      for (int out = 0; out < num_outputs; out += 4) {
        __m128 outputs = _mm_loadu_ps(&layer_bias[out]);
        for (int in = 0; in < num_inputs; in += 8) {
          nn_propagate_8to4(&input_nodes[in],
                            &layer_weights[out * num_inputs + in], &outputs,
                            num_inputs);
        }
        if (!output_layer) nn_activate4(&outputs);
        _mm_storeu_ps(&output_nodes[out], outputs);
      }
    } else if (num_inputs % 4 == 0 && num_outputs % 4 == 0) {
      for (int out = 0; out < num_outputs; out += 4) {
        __m128 outputs = _mm_loadu_ps(&layer_bias[out]);
        for (int in = 0; in < num_inputs; in += 4) {
          av1_nn_propagate_4to4_sse3(&input_nodes[in],
                                     &layer_weights[out * num_inputs + in],
                                     &outputs, num_inputs);
        }
        if (!output_layer) nn_activate4(&outputs);
        _mm_storeu_ps(&output_nodes[out], outputs);
      }
    } else if (num_inputs % 8 == 0) {
      for (int out = 0; out < num_outputs; out++) {
        __m128 total = _mm_load1_ps(&layer_bias[out]);
        for (int in = 0; in < num_inputs; in += 8) {
          nn_propagate_8to1(&input_nodes[in],
                            &layer_weights[out * num_inputs + in], &total);
        }
        if (!output_layer) nn_activate4(&total);
        output_nodes[out] = _mm_cvtss_f32(total);
      }
    } else if (num_inputs % 4 == 0) {
      for (int out = 0; out < num_outputs; out++) {
        __m128 total = _mm_load1_ps(&layer_bias[out]);
        for (int in = 0; in < num_inputs; in += 4) {
          av1_nn_propagate_4to1_sse3(
              &input_nodes[in], &layer_weights[out * num_inputs + in], &total);
        }
        if (!output_layer) nn_activate4(&total);
        output_nodes[out] = _mm_cvtss_f32(total);
      }
    } else {
      // Use SSE instructions for scalar operations to avoid the latency of
      // swapping between SIMD and FPU modes.
      for (int out = 0; out < num_outputs; out++) {
        __m128 total = _mm_load1_ps(&layer_bias[out]);
        for (int in_node = 0; in_node < num_inputs; in_node++) {
          __m128 input = _mm_load1_ps(&input_nodes[in_node]);
          __m128 weight =
              _mm_load1_ps(&layer_weights[num_inputs * out + in_node]);
          total = _mm_add_ps(total, _mm_mul_ps(input, weight));
        }
        if (!output_layer) nn_activate4(&total);
        output_nodes[out] = _mm_cvtss_f32(total);
      }
    }
    input_nodes = output_nodes;
    num_inputs = num_outputs;
    buf_index = 1 - buf_index;
  }
  if (reduce_prec) av1_nn_output_prec_reduce(output, nn_config->num_outputs);
}